

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O3

void glslang::OutputConstantUnion
               (TInfoSink *out,TIntermTyped *node,TConstUnionArray *constUnion,EExtraOutput extra,
               int depth)

{
  TInfoSinkBase *this;
  TBasicType TVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer pTVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  longlong lVar6;
  ulong uVar7;
  double dVar8;
  char *pcVar9;
  long lVar10;
  char buf [300];
  char local_188 [344];
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  uVar3 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar2));
  if (0 < (int)uVar3) {
    this = &out->debug;
    uVar7 = 0;
    do {
      OutputTreeText(out,&node->super_TIntermNode,depth);
      pTVar4 = (constUnion->unionArray->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TVar1 = pTVar4[uVar7].type;
      if (0x1a < TVar1 - EbtFloat) {
switchD_003ecd0f_caseD_d:
        iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
        TInfoSinkBase::message
                  (&out->info,EPrefixInternalError,"Unknown constant",
                   (TSourceLoc *)CONCAT44(extraout_var_00,iVar2),false,false);
        goto LAB_003ed035;
      }
      pTVar4 = pTVar4 + uVar7;
      switch(TVar1) {
      case EbtFloat:
      case EbtDouble:
      case EbtFloat16:
        dVar8 = (pTVar4->field_0).dConst;
        if (ABS(dVar8) == INFINITY) {
          if (0.0 <= dVar8) {
            pcVar9 = "+1.#INF";
          }
          else {
            pcVar9 = "-1.#INF";
          }
          goto LAB_003ed021;
        }
        if (NAN(dVar8)) {
          pcVar9 = "1.#IND";
          goto LAB_003ed021;
        }
        pcVar9 = "%f";
        if (1000000000000.0 < ABS(dVar8)) {
          pcVar9 = "%-.13e";
        }
        if (ABS(dVar8) < 1e-05) {
          pcVar9 = "%-.13e";
        }
        if (dVar8 == (double)(tSamplePos)0x0) {
          pcVar9 = "%f";
        }
        iVar2 = snprintf(local_188,0x154,pcVar9);
        if (0x153 < iVar2) {
          __assert_fail("len < maxSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/intermOut.cpp"
                        ,0x453,
                        "void glslang::OutputDouble(TInfoSink &, double, TOutputTraverser::EExtraOutput)"
                       );
        }
        if ((((5 < iVar2) && (local_188[iVar2 - 5] == 'e')) &&
            ((local_188[iVar2 - 4] == '-' || (local_188[iVar2 - 4] == '+')))) &&
           (local_188[iVar2 - 3U] == '0')) {
          local_188[iVar2 - 3U] = local_188[iVar2 - 2U];
          local_188[iVar2 - 2U] = local_188[iVar2 - 1U];
          local_188[iVar2 - 1U] = '\0';
        }
        TInfoSinkBase::append(this,local_188);
        if (extra == BinaryDoubleOutput) {
          TInfoSinkBase::append(this," : ");
          lVar10 = 0x40;
          do {
            pcVar9 = "1";
            if (-1 < (long)dVar8) {
              pcVar9 = "0";
            }
            TInfoSinkBase::append(this,pcVar9);
            dVar8 = (double)((long)dVar8 * 2 + 1);
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        goto LAB_003ed026;
      case EbtInt8:
        uVar5 = (ulong)(uint)(int)(pTVar4->field_0).i8Const;
        pcVar9 = "%d (%s)";
        break;
      case EbtUint8:
        uVar5 = (ulong)(pTVar4->field_0).u8Const;
        pcVar9 = "%u (%s)";
        break;
      case EbtInt16:
        uVar5 = (ulong)(uint)(int)(pTVar4->field_0).i16Const;
        pcVar9 = "%d (%s)";
        break;
      case EbtUint16:
        uVar5 = (ulong)(pTVar4->field_0).u16Const;
        pcVar9 = "%u (%s)";
        break;
      case EbtInt:
        uVar5 = (ulong)(pTVar4->field_0).uConst;
        pcVar9 = "%d (%s)";
        break;
      case EbtUint:
        uVar5 = (ulong)(pTVar4->field_0).uConst;
        pcVar9 = "%u (%s)";
        break;
      case EbtInt64:
        lVar6 = (pTVar4->field_0).i64Const;
        pcVar9 = "%lld (%s)";
        goto LAB_003ecfee;
      case EbtUint64:
        lVar6 = (pTVar4->field_0).i64Const;
        pcVar9 = "%llu (%s)";
LAB_003ecfee:
        snprintf(local_188,300,pcVar9,lVar6);
        goto LAB_003ed01b;
      case EbtBool:
        pcVar9 = "false";
        if ((pTVar4->field_0).i8Const != '\0') {
          pcVar9 = "true";
        }
        TInfoSinkBase::append(this,pcVar9);
        TInfoSinkBase::append(this," (");
        TInfoSinkBase::append(this,"const bool");
        pcVar9 = ")";
        goto LAB_003ed021;
      default:
        goto switchD_003ecd0f_caseD_d;
      case EbtString:
        TInfoSinkBase::append(this,"\"");
        TInfoSinkBase::append
                  (this,(((constUnion->unionArray->
                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ).
                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].field_0.sConst)->
                        _M_dataplus)._M_p);
        pcVar9 = "\"\n";
        goto LAB_003ed030;
      }
      snprintf(local_188,300,pcVar9,uVar5);
LAB_003ed01b:
      pcVar9 = local_188;
LAB_003ed021:
      TInfoSinkBase::append(this,pcVar9);
LAB_003ed026:
      pcVar9 = "\n";
LAB_003ed030:
      TInfoSinkBase::append(this,pcVar9);
LAB_003ed035:
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar3);
  }
  return;
}

Assistant:

static void OutputConstantUnion(TInfoSink& out, const TIntermTyped* node, const TConstUnionArray& constUnion,
    TOutputTraverser::EExtraOutput extra, int depth)
{
    int size = node->getType().computeNumComponents();

    for (int i = 0; i < size; i++) {
        OutputTreeText(out, node, depth);
        switch (constUnion[i].getType()) {
        case EbtBool:
            if (constUnion[i].getBConst())
                out.debug << "true";
            else
                out.debug << "false";

            out.debug << " (" << "const bool" << ")";

            out.debug << "\n";
            break;
        case EbtFloat:
        case EbtDouble:
        case EbtFloat16:
            OutputDouble(out, constUnion[i].getDConst(), extra);
            out.debug << "\n";
            break;
        case EbtInt8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI8Const(), "const int8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU8Const(), "const uint8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI16Const(), "const int16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU16Const(), "const uint16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getIConst(), "const int");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getUConst(), "const uint");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%lld (%s)", constUnion[i].getI64Const(), "const int64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%llu (%s)", constUnion[i].getU64Const(), "const uint64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtString:
            out.debug << "\"" << constUnion[i].getSConst()->c_str() << "\"\n";
            break;
        default:
            out.info.message(EPrefixInternalError, "Unknown constant", node->getLoc());
            break;
        }
    }
}